

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase107::run(TestCase107 *this)

{
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ReaderOptions options;
  DebugExpression<bool> _kjCondition;
  Fault f;
  ArrayPtr<const_capnp::word> segments [1];
  AlignedData<4> nonNullEmptyStruct;
  SegmentArrayMessageReader messageReader;
  
  segments[0].ptr = (word *)&nonNullEmptyStruct;
  nonNullEmptyStruct.words[2].content = (word)0xfffffffc;
  nonNullEmptyStruct.words[3].content = (word)0xeeeeeeeeeeeeeeee;
  nonNullEmptyStruct.words[0].content = (word)0x2000000000000;
  nonNullEmptyStruct.words[1].content = (word)0x100000004;
  segments[0].size_ = 4;
  segments_00.size_ = 1;
  segments_00.ptr = segments;
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  SegmentArrayMessageReader::SegmentArrayMessageReader(&messageReader,segments_00,options);
  _kjCondition.value = MessageReader::isCanonical(&messageReader.super_MessageReader);
  if (_kjCondition.value) {
    SegmentArrayMessageReader::~SegmentArrayMessageReader(&messageReader);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/canonicalize-test.c++"
             ,0x7c,FAILED,"messageReader.isCanonical()","_kjCondition,",&_kjCondition);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(Encoding, DefaultsFromEmptyMessage) {
  AlignedData<1> emptyMessage = {{0, 0, 0, 0, 0, 0, 0, 0}};

  kj::ArrayPtr<const word> segments[1] = {kj::arrayPtr(emptyMessage.words, 1)};
  SegmentArrayMessageReader reader(kj::arrayPtr(segments, 1));

  checkTestMessage(reader.getRoot<TestDefaults>());
  checkTestMessage(readMessageUnchecked<TestDefaults>(emptyMessage.words));
}